

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O3

int __thiscall
TPZSkylNSymMatrix<float>::Subst_LForward(TPZSkylNSymMatrix<float> *this,TPZFMatrix<float> *B)

{
  char cVar1;
  long lVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  int iVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float fVar14;
  long local_48;
  
  lVar9 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar7 = 0;
  if ((lVar9 == CONCAT44(extraout_var,iVar6)) &&
     ((cVar1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar6 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    iVar7 = 1;
    if (CONCAT44(extraout_var_00,iVar6) != 0 && -1 < extraout_var_00) {
      lVar9 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
      local_48 = -4;
      lVar11 = 0;
      do {
        if (0 < lVar9) {
          lVar2 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
          lVar12 = 0;
          lVar10 = 0;
          do {
            ppfVar3 = (this->fElemb).fStore;
            pfVar4 = ppfVar3[lVar11 + 1];
            if (lVar2 <= lVar11) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pfVar5 = B->fElem;
            pfVar13 = ppfVar3[lVar11] + 1;
            fVar14 = 0.0;
            if (pfVar13 < pfVar4) {
              pfVar8 = (float *)((long)pfVar5 + lVar2 * lVar12 + local_48);
              do {
                fVar14 = fVar14 + *pfVar13 * *pfVar8;
                pfVar13 = pfVar13 + 1;
                pfVar8 = pfVar8 + -1;
              } while (pfVar13 < pfVar4);
            }
            if ((lVar2 <= lVar11) ||
               (lVar9 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol, lVar9 <= lVar10)) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pfVar5[lVar2 * lVar10 + lVar11] = pfVar5[lVar2 * lVar10 + lVar11] - fVar14;
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 4;
          } while (lVar10 < lVar9);
        }
        lVar11 = lVar11 + 1;
        local_48 = local_48 + 4;
      } while (lVar11 != CONCAT44(extraout_var_00,iVar6));
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}